

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MessageOptions::MergeFrom(MessageOptions *this,MessageOptions *from)

{
  uint uVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff10;
  ExtensionSet *in_stack_ffffffffffffff58;
  ExtensionSet *in_stack_ffffffffffffff60;
  
  internal::ExtensionSet::MergeFrom(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 0x20);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
      in_stack_ffffffffffffff10 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff10 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_ffffffffffffff10,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_ffffffffffffff08);
  uVar1 = *(uint *)(in_RSI + 0x28);
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(in_RDI + 0x48) = *(byte *)(in_RSI + 0x48) & 1;
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(in_RDI + 0x49) = *(byte *)(in_RSI + 0x49) & 1;
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(in_RDI + 0x4a) = *(byte *)(in_RSI + 0x4a) & 1;
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(in_RDI + 0x4b) = *(byte *)(in_RSI + 0x4b) & 1;
    }
    *(uint *)(in_RDI + 0x28) = uVar1 | *(uint *)(in_RDI + 0x28);
  }
  return;
}

Assistant:

void MessageOptions::MergeFrom(const MessageOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MessageOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      message_set_wire_format_ = from.message_set_wire_format_;
    }
    if (cached_has_bits & 0x00000002u) {
      no_standard_descriptor_accessor_ = from.no_standard_descriptor_accessor_;
    }
    if (cached_has_bits & 0x00000004u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00000008u) {
      map_entry_ = from.map_entry_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}